

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_soundex(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  char in_RAX [8];
  char *pcVar4;
  ushort **ppuVar5;
  __int32_t **pp_Var6;
  uchar uVar7;
  long lVar8;
  char *zString;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  char zResult [8];
  
  zString = zResult;
  zResult = in_RAX;
  if (nArg < 1) {
    zString = "";
    iVar3 = 0;
  }
  else {
    uVar9 = 0;
    pcVar4 = jx9_value_to_string(*apArg,(int *)0x0);
    while( true ) {
      bVar1 = pcVar4[uVar9];
      uVar10 = (ulong)bVar1;
      if (0xbe < (byte)(bVar1 - 1)) break;
      ppuVar5 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar5 + uVar10 * 2 + 1) & 4) != 0) goto LAB_0012ca9c;
      uVar9 = uVar9 + 1;
    }
    if (uVar10 == 0) {
      zString = "?000";
    }
    else {
LAB_0012ca9c:
      uVar7 = ""[bVar1 & 0x7f];
      pp_Var6 = __ctype_toupper_loc();
      zResult[0] = (char)(*pp_Var6)[uVar10];
      iVar3 = 1;
      for (pbVar11 = (byte *)(pcVar4 + (uVar9 & 0xffffffff)); (iVar3 < 4 && (*pbVar11 != 0));
          pbVar11 = pbVar11 + 1) {
        uVar2 = ""[*pbVar11 & 0x7f];
        if (uVar2 == '\0') {
          uVar7 = '\0';
        }
        else if (uVar2 != uVar7) {
          lVar8 = (long)iVar3;
          iVar3 = iVar3 + 1;
          zResult[lVar8] = uVar2 + '0';
          uVar7 = uVar2;
        }
      }
      for (lVar8 = (long)iVar3; lVar8 < 4; lVar8 = lVar8 + 1) {
        zResult[lVar8] = '0';
      }
    }
    iVar3 = 4;
  }
  jx9_result_string(pCtx,zString,iVar3);
  return 0;
}

Assistant:

static int jx9Builtin_soundex(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn;
	char zResult[8];
	int i, j;
	static const unsigned char iCode[] = {
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 1, 2, 3, 0, 1, 2, 0, 0, 2, 2, 4, 5, 5, 0, 
		1, 2, 6, 2, 3, 0, 1, 0, 2, 0, 2, 0, 0, 0, 0, 0, 
		0, 0, 1, 2, 3, 0, 1, 2, 0, 0, 2, 2, 4, 5, 5, 0, 
		1, 2, 6, 2, 3, 0, 1, 0, 2, 0, 2, 0, 0, 0, 0, 0, 
	};
	if( nArg < 1 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	zIn = (unsigned char *)jx9_value_to_string(apArg[0], 0);
	for(i=0; zIn[i] && zIn[i] < 0xc0 && !SyisAlpha(zIn[i]); i++){}
	if( zIn[i] ){
		unsigned char prevcode = iCode[zIn[i]&0x7f];
		zResult[0] = (char)SyToUpper(zIn[i]);
		for(j=1; j<4 && zIn[i]; i++){
			int code = iCode[zIn[i]&0x7f];
			if( code>0 ){
				if( code!=prevcode ){
					prevcode = (unsigned char)code;
					zResult[j++] = (char)code + '0';
				}
			}else{
				prevcode = 0;
			}
		}
		while( j<4 ){
			zResult[j++] = '0';
		}
		jx9_result_string(pCtx, zResult, 4);
	}else{
	  jx9_result_string(pCtx, "?000", 4);
	}
	return JX9_OK;
}